

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QPolygonF * __thiscall
QGraphicsItem::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointF> local_48;
  qreal qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform((this->d_ptr).d);
  if (bVar2) {
    pQVar1 = (this->d_ptr).d;
    local_48.d = (Data *)(rect->xp + (pQVar1->sceneTransform).m_matrix[2][0]);
    local_48.ptr = (QPointF *)(rect->yp + (pQVar1->sceneTransform).m_matrix[2][1]);
    local_48.size = (qsizetype)rect->w;
    qStack_30 = rect->h;
    QPolygonF::QPolygonF(__return_storage_ptr__,(QRectF *)&local_48);
  }
  else {
    QPolygonF::QPolygonF((QPolygonF *)&local_48,(QRectF *)rect);
    QTransform::map(__return_storage_ptr__);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.map(rect);
}